

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

MessageOptions * __thiscall
google::protobuf::DescriptorProto::mutable_options(DescriptorProto *this)

{
  MessageOptions *this_00;
  DescriptorProto *this_local;
  
  set_has_options(this);
  if (this->options_ == (MessageOptions *)0x0) {
    this_00 = (MessageOptions *)operator_new(0x68);
    MessageOptions::MessageOptions(this_00);
    this->options_ = this_00;
  }
  return this->options_;
}

Assistant:

inline ::google::protobuf::MessageOptions* DescriptorProto::mutable_options() {
  set_has_options();
  if (options_ == NULL) options_ = new ::google::protobuf::MessageOptions;
  return options_;
}